

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.h
# Opt level: O2

object __thiscall
pybind11::eval<(pybind11::eval_mode)0>(pybind11 *this,str *expr,object *global,object *local)

{
  long lVar1;
  error_already_set *this_00;
  string buffer;
  string local_48;
  
  if ((local->super_handle).m_ptr == (PyObject *)0x0) {
    object::operator=(local,global);
  }
  str::operator_cast_to_string(&local_48,expr);
  std::operator+(&buffer,"# -*- coding: utf-8 -*-\n",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  lVar1 = PyRun_StringFlags(buffer._M_dataplus._M_p,0x102,(global->super_handle).m_ptr,
                            (local->super_handle).m_ptr,0);
  if (lVar1 != 0) {
    *(long *)this = lVar1;
    std::__cxx11::string::~string((string *)&buffer);
    return (object)(handle)this;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

object eval(str expr, object global = globals(), object local = object()) {
    if (!local)
        local = global;

    /* PyRun_String does not accept a PyObject / encoding specifier,
       this seems to be the only alternative */
    std::string buffer = "# -*- coding: utf-8 -*-\n" + (std::string) expr;

    int start;
    switch (mode) {
        case eval_expr:             start = Py_eval_input;   break;
        case eval_single_statement: start = Py_single_input; break;
        case eval_statements:       start = Py_file_input;   break;
        default: pybind11_fail("invalid evaluation mode");
    }

    PyObject *result = PyRun_String(buffer.c_str(), start, global.ptr(), local.ptr());
    if (!result)
        throw error_already_set();
    return reinterpret_steal<object>(result);
}